

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall
QStandardItemModelPrivate::_q_emitItemChanged
          (QStandardItemModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  bool bVar4;
  QStandardItem *pQVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  uint local_88;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStandardItem *local_50;
  void *local_48;
  QStandardItem **ppQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (topLeft->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_68 = (undefined1 *)0xffffffffffffffff;
    puStack_60 = (undefined1 *)0x0;
    local_58 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_68,pQVar2,topLeft);
  }
  if (topLeft->r <= bottomRight->r) {
    iVar8 = topLeft->r;
    do {
      iVar6 = topLeft->c;
      if (topLeft->c <= bottomRight->c) {
        do {
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = 0xaaaaaaaa;
          uStack_84 = 0xaaaaaaaa;
          uStack_80 = 0xaaaaaaaa;
          uStack_7c = 0xaaaaaaaa;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_88,pQVar1,iVar8,iVar6,&local_68);
          if ((int)(local_88 | uStack_84) < 0 || local_78 == (undefined1 *)0x0) {
            pQVar5 = (this->root).d;
          }
          else {
            if ((local_78 == *(undefined1 **)&this->field_0x8) &&
               (CONCAT44(uStack_7c,uStack_80) != 0)) {
              lVar3 = *(long *)(CONCAT44(uStack_7c,uStack_80) + 8);
              iVar7 = -1;
              if ((-1 < (int)(local_88 | uStack_84)) &&
                 (((int)local_88 < *(int *)(lVar3 + 0x40) &&
                  ((int)uStack_84 < *(int *)(lVar3 + 0x44))))) {
                iVar7 = *(int *)(lVar3 + 0x44) * local_88 + uStack_84;
              }
              if (iVar7 != -1) {
                pQVar5 = *(QStandardItem **)(*(long *)(lVar3 + 0x30) + (long)iVar7 * 8);
                goto LAB_005510ad;
              }
            }
            pQVar5 = (QStandardItem *)0x0;
          }
LAB_005510ad:
          if (pQVar5 != (QStandardItem *)0x0) {
            local_48 = (void *)0x0;
            ppQStack_40 = &local_50;
            local_50 = pQVar5;
            QMetaObject::activate(pQVar1,&QStandardItemModel::staticMetaObject,0,&local_48);
          }
          bVar4 = iVar6 < bottomRight->c;
          iVar6 = iVar6 + 1;
        } while (bVar4);
      }
      bVar4 = iVar8 < bottomRight->r;
      iVar8 = iVar8 + 1;
    } while (bVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStandardItemModelPrivate::_q_emitItemChanged(const QModelIndex &topLeft,
                                                   const QModelIndex &bottomRight)
{
    Q_Q(QStandardItemModel);
    QModelIndex parent = topLeft.parent();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        for (int column = topLeft.column(); column <= bottomRight.column(); ++column) {
            QModelIndex index = q->index(row, column, parent);
            if (QStandardItem *item = itemFromIndex(index))
                emit q->itemChanged(item);
        }
    }
}